

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  int iVar1;
  char *Str;
  char *Str_00;
  raw_ostream *prVar2;
  undefined1 local_68 [8];
  raw_string_ostream outStream;
  char *filename;
  char *err_message;
  int err_code;
  SQLiteBuildDB *this_local;
  string *out;
  
  iVar1 = sqlite3_errcode(*(undefined8 *)((long)this + 0x30));
  Str = (char *)sqlite3_errmsg(*(undefined8 *)((long)this + 0x30));
  Str_00 = (char *)sqlite3_db_filename(*(undefined8 *)((long)this + 0x30),"main");
  outStream.OS._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  llvm::raw_string_ostream::raw_string_ostream
            ((raw_string_ostream *)local_68,__return_storage_ptr__);
  prVar2 = llvm::raw_ostream::operator<<
                     ((raw_ostream *)local_68,"error: accessing build database \"");
  prVar2 = llvm::raw_ostream::operator<<(prVar2,Str_00);
  prVar2 = llvm::raw_ostream::operator<<(prVar2,"\": ");
  llvm::raw_ostream::operator<<(prVar2,Str);
  if ((iVar1 == 5) || (iVar1 == 6)) {
    llvm::raw_ostream::operator<<
              ((raw_ostream *)local_68,
               " Possibly there are two concurrent builds running in the same filesystem location.")
    ;
  }
  llvm::raw_ostream::flush((raw_ostream *)local_68);
  outStream.OS._7_1_ = 1;
  llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_68);
  if ((outStream.OS._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getCurrentErrorMessage() {
    int err_code = sqlite3_errcode(db);
    const char* err_message = sqlite3_errmsg(db);
    const char* filename = sqlite3_db_filename(db, "main");

    std::string out;
    llvm::raw_string_ostream outStream(out);
    outStream << "error: accessing build database \"" << filename << "\": " << err_message;

    if (err_code == SQLITE_BUSY || err_code == SQLITE_LOCKED) {
      outStream << " Possibly there are two concurrent builds running in the same filesystem location.";
    }

    outStream.flush();
    return out;
  }